

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuspendingreply.cpp
# Opt level: O3

QVariant * __thiscall
QDBusPendingReplyBase::argumentAt
          (QVariant *__return_storage_ptr__,QDBusPendingReplyBase *this,int index)

{
  QDBusPendingCallPrivate *this_00;
  anon_union_24_3_e3d07ef4_for_data *paVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QVariant> local_60;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QDBusPendingCall).d.d.ptr;
  if (this_00 == (QDBusPendingCallPrivate *)0x0) {
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    QDBusPendingCallPrivate::waitForFinished(this_00);
    QDBusMessage::arguments
              ((QList<QVariant> *)&local_60,&((this->super_QDBusPendingCall).d.d.ptr)->replyMessage)
    ;
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = 0;
    local_48._16_8_ = 0;
    local_30 = 2;
    paVar1 = (anon_union_24_3_e3d07ef4_for_data *)(local_60.ptr + index);
    if ((ulong)local_60.size <= (ulong)(long)index) {
      paVar1 = &local_48;
    }
    QVariant::QVariant(__return_storage_ptr__,(QVariant *)paVar1);
    QVariant::~QVariant((QVariant *)&local_48);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QDBusPendingReplyBase::argumentAt(int index) const
{
    if (!d)
        return QVariant();

    d->waitForFinished();   // bypasses "const"

    return d->replyMessage.arguments().value(index);
}